

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall Catch::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  std::__cxx11::string::~string((string *)&(this->m_info).message);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)this);
  return;
}

Assistant:

MessageBuilder( StringRef macroName,
                        SourceLineInfo const& lineInfo,
                        ResultWas::OfType type ):
            m_info(macroName, lineInfo, type) {}